

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall
GameEngine::fillMapPattern
          (GameEngine *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *cells)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  bool bVar1;
  cellType cVar2;
  element_type *peVar3;
  size_t sVar4;
  size_t __n;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this_01;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  reference this_04;
  cellType *pcVar5;
  ulong local_58;
  size_t column;
  size_t row;
  allocator<int> local_31;
  vector<int,_std::allocator<int>_> local_30;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *cells_local;
  GameEngine *this_local;
  
  local_18 = cells;
  cells_local = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)this;
  bVar1 = std::operator==(&this->map,(nullptr_t)0x0);
  if (bVar1) {
    generateMap(this);
  }
  this_00 = local_18;
  peVar3 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  sVar4 = Map::getHeight(peVar3);
  peVar3 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  __n = Map::getWidth(peVar3);
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__n,&local_31);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::assign(this_00,sVar4,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  std::allocator<int>::~allocator(&local_31);
  column = 0;
  while( true ) {
    peVar3 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    sVar4 = Map::getHeight(peVar3);
    if (sVar4 <= column) break;
    local_58 = 0;
    while( true ) {
      peVar3 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                         );
      sVar4 = Map::getWidth(peVar3);
      if (sVar4 <= local_58) break;
      peVar3 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                         );
      this_01 = Map::operator[](peVar3,column);
      this_02 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](this_01,local_58);
      this_03 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_02);
      cVar2 = CellType::getType(this_03);
      this_04 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](local_18,column);
      pcVar5 = (cellType *)std::vector<int,_std::allocator<int>_>::operator[](this_04,local_58);
      *pcVar5 = cVar2;
      local_58 = local_58 + 1;
    }
    column = column + 1;
  }
  return;
}

Assistant:

void GameEngine::fillMapPattern(std::vector<std::vector<int32_t> > &cells) {
  if (map == nullptr) {
    generateMap();
  }

  cells.assign(map->getHeight(), std::vector<int32_t>(map->getWidth()));

  for (size_t row = 0; row < map->getHeight(); ++row) {
    for (size_t column = 0; column < map->getWidth(); ++column) {
      cells[row][column] = static_cast<int32_t>((*map)[row][column]->getType());
    }
  }
}